

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::routing_table::log_node_failed(routing_table *this,node_id *nid,node_entry *ne)

{
  byte bVar1;
  dht_logger *pdVar2;
  int iVar3;
  time_point tVar4;
  difference_type in_RCX;
  uint uVar5;
  endpoint *ep;
  span<const_char> in;
  string local_88;
  string local_68;
  endpoint local_44;
  
  pdVar2 = this->m_log;
  if (pdVar2 != (dht_logger *)0x0) {
    iVar3 = (**pdVar2->_vptr_dht_logger)(pdVar2,2);
    if ((char)iVar3 != '\0') {
      pdVar2 = this->m_log;
      in.m_len = in_RCX;
      in.m_ptr = (char *)0x14;
      aux::to_hex_abi_cxx11_(&local_68,(aux *)nid,in);
      aux::union_endpoint::operator_cast_to_basic_endpoint(&local_44,&ne->endpoint);
      aux::print_endpoint_abi_cxx11_(&local_88,(aux *)&local_44,ep);
      bVar1 = ne->timeout_count;
      tVar4 = aux::time_now();
      uVar5 = (uint)bVar1;
      if (bVar1 == 0xff) {
        uVar5 = 0;
      }
      (*pdVar2->_vptr_dht_logger[1])
                (pdVar2,2,"NODE FAILED id: %s ip: %s fails: %d pinged: %d up-time: %d",
                 local_68._M_dataplus._M_p,local_88._M_dataplus._M_p,(ulong)uVar5,
                 (ulong)(bVar1 != 0xff),
                 ((long)tVar4.__d.__r - (ne->first_seen).__d.__r) / 1000000000);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return;
}

Assistant:

void routing_table::log_node_failed(node_id const& nid, node_entry const& ne) const
{
	if (m_log != nullptr && m_log->should_log(dht_logger::routing_table))
	{
		m_log->log(dht_logger::routing_table, "NODE FAILED id: %s ip: %s fails: %d pinged: %d up-time: %d"
			, aux::to_hex(nid).c_str(), aux::print_endpoint(ne.ep()).c_str()
			, ne.fail_count()
			, int(ne.pinged())
			, int(total_seconds(aux::time_now() - ne.first_seen)));
	}
}